

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

int * Cudd_VectorSupportIndex(DdManager *dd,DdNode **F,int n)

{
  int *support;
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar3 = dd->size;
  if (dd->size < dd->sizeZ) {
    uVar3 = dd->sizeZ;
  }
  support = (int *)malloc((long)(int)uVar3 << 2);
  if (support == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    uVar1 = 0;
    uVar2 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar2 = uVar1;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      support[uVar1] = 0;
    }
    uVar1 = 0;
    uVar2 = (ulong)(uint)n;
    if (n < 1) {
      uVar2 = uVar1;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      ddSupportStep((DdNode *)((ulong)F[uVar1] & 0xfffffffffffffffe),support);
    }
    for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      ddClearFlag((DdNode *)((ulong)F[uVar1] & 0xfffffffffffffffe));
    }
  }
  return support;
}

Assistant:

int *
Cudd_VectorSupportIndex(
  DdManager * dd /* manager */,
  DdNode ** F /* array of DDs whose support is sought */,
  int  n /* size of the array */)
{
    int *support;
    int i;
    int size;

    /* Allocate and initialize support array for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    support = ABC_ALLOC(int,size);
    if (support == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < size; i++) {
        support[i] = 0;
    }

    /* Compute support and clean up markers. */
    for (i = 0; i < n; i++) {
        ddSupportStep(Cudd_Regular(F[i]),support);
    }
    for (i = 0; i < n; i++) {
        ddClearFlag(Cudd_Regular(F[i]));
    }

    return(support);

}